

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

void __thiscall QNetworkRequestFactory::setBaseUrl(QNetworkRequestFactory *this,QUrl *url)

{
  char cVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  
  cVar1 = comparesEqual(&((this->d).d.ptr)->baseUrl,url);
  if (cVar1 != '\0') {
    return;
  }
  pQVar2 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
    pQVar2 = (this->d).d.ptr;
  }
  QUrl::operator=(&pQVar2->baseUrl,url);
  return;
}

Assistant:

void QNetworkRequestFactory::setBaseUrl(const QUrl &url)
{
    if (d->baseUrl == url)
        return;

    d.detach();
    d->baseUrl = url;
}